

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O3

void __thiscall
util::exception::
exception<char_const(&)[22],unsigned_char&,char_const(&)[6],CylHead&,char_const(&)[9],int&>
          (exception *this,char (*args) [22],uchar *args_1,char (*args_2) [6],CylHead *args_3,
          char (*args_4) [9],int *args_5)

{
  _Alloc_hider in_stack_ffffffffffffffd0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_20;
  
  make_string<char_const(&)[22],unsigned_char&,char_const(&)[6],CylHead&,char_const(&)[9],int&>
            ((string *)&stack0xffffffffffffffd0,(util *)args,(char (*) [22])args_1,(uchar *)args_2,
             (char (*) [6])args_3,(CylHead *)args_4,(char (*) [9])args_5,
             (int *)in_stack_ffffffffffffffd0._M_p);
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&stack0xffffffffffffffd0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)in_stack_ffffffffffffffd0._M_p != &local_20) {
    operator_delete(in_stack_ffffffffffffffd0._M_p,local_20._M_allocated_capacity + 1);
  }
  *(undefined ***)this = &PTR__runtime_error_001dac18;
  return;
}

Assistant:

explicit exception(Args&& ... args)
        : std::runtime_error(make_string(std::forward<Args>(args)...)) {}